

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt_and_hash.c
# Opt level: O3

int main(int argc,char **argv)

{
  mbedtls_cipher_type_t cipher_type;
  mbedtls_md_type_t md_type;
  int *__s;
  uchar *input;
  char **ppcVar1;
  byte bVar2;
  uchar uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  FILE *__stream;
  FILE *__s_00;
  mbedtls_cipher_info_t *pmVar7;
  mbedtls_md_info_t *pmVar8;
  FILE *__stream_00;
  size_t sVar9;
  mbedtls_cipher_type_t *pmVar10;
  mbedtls_md_type_t *pmVar11;
  char *pcVar12;
  ulong uVar13;
  undefined8 *puVar14;
  size_t sVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  size_t olen;
  int n;
  mbedtls_md_context_t md_ctx;
  uchar IV [16];
  mbedtls_cipher_context_t cipher_ctx;
  uchar key [512];
  uchar buffer [1024];
  uchar output [1024];
  int local_b5c;
  size_t local_b40;
  char **local_b38;
  char **local_b30;
  uint local_b28;
  uchar local_b24 [4];
  mbedtls_md_context_t local_b20;
  mbedtls_md_info_t *local_b08;
  mbedtls_cipher_info_t *local_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  size_t local_ae0;
  mbedtls_cipher_context_t local_ad8;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  uchar local_a38 [512];
  undefined8 local_838;
  undefined8 uStack_830;
  uchar local_438 [1032];
  
  mbedtls_cipher_init(&local_ad8);
  mbedtls_md_init(&local_b20);
  if (argc == 7) {
    uVar5 = atoi(argv[1]);
    if (uVar5 < 2) {
      pcVar12 = argv[2];
      iVar6 = strcmp(pcVar12,argv[3]);
      if (iVar6 == 0) {
        main_cold_25();
      }
      else {
        __stream = fopen(pcVar12,"rb");
        if (__stream == (FILE *)0x0) {
          main_cold_24();
        }
        else {
          __s_00 = fopen(argv[3],"wb+");
          if (__s_00 != (FILE *)0x0) {
            local_b38 = argv;
            local_b30 = argv + 2;
            pmVar7 = mbedtls_cipher_info_from_string(argv[4]);
            if (pmVar7 == (mbedtls_cipher_info_t *)0x0) {
              main_cold_22();
              local_b5c = 1;
              goto LAB_00107286;
            }
            iVar6 = mbedtls_cipher_setup(&local_ad8,pmVar7);
            if (iVar6 == 0) {
              local_b28 = uVar5;
              pmVar8 = mbedtls_md_info_from_string(local_b38[5]);
              if (pmVar8 == (mbedtls_md_info_t *)0x0) {
                main_cold_21();
                goto LAB_001070b1;
              }
              local_b5c = 1;
              iVar6 = mbedtls_md_setup(&local_b20,pmVar8,1);
              ppcVar1 = local_b38;
              if (iVar6 == 0) {
                __stream_00 = fopen(local_b38[6],"rb");
                local_b08 = pmVar8;
                local_b00 = pmVar7;
                if (__stream_00 == (FILE *)0x0) {
                  __s = (int *)ppcVar1[6];
                  if (*__s == 0x3a786568) {
                    sVar9 = 0;
                    iVar6 = __isoc99_sscanf(__s + 1,"%02X",local_b24);
                    if (0 < iVar6) {
                      lVar16 = (long)__s + 6;
                      uVar13 = 0;
                      do {
                        sVar9 = uVar13 + 1;
                        local_a38[uVar13] = local_b24[0];
                        iVar6 = __isoc99_sscanf(lVar16,"%02X",local_b24);
                        if (iVar6 < 1) break;
                        lVar16 = lVar16 + 2;
                        bVar18 = uVar13 < 0x1ff;
                        uVar13 = sVar9;
                      } while (bVar18);
                    }
                  }
                  else {
                    sVar15 = strlen((char *)__s);
                    sVar9 = 0x200;
                    if (sVar15 < 0x200) {
                      sVar9 = sVar15;
                    }
                    memcpy(local_a38,__s,sVar9);
                  }
                }
                else {
                  sVar9 = fread(local_a38,1,0x200,__stream_00);
                  fclose(__stream_00);
                }
                local_b5c = 1;
                local_ae0 = sVar9;
                iVar6 = fileno(__stream);
                uVar13 = lseek(iVar6,0,2);
                if ((long)uVar13 < 0) {
                  perror("lseek");
                  goto LAB_00107159;
                }
                iVar6 = fseek(__stream,0,0);
                if (iVar6 < 0) {
                  main_cold_20();
                }
                else if ((local_b28 & 1) == 0) {
                  puVar14 = &local_838;
                  lVar16 = 0;
                  do {
                    *(char *)puVar14 = (char)(uVar13 >> ((byte)lVar16 & 0x3f));
                    lVar16 = lVar16 + 8;
                    puVar14 = (undefined8 *)((long)puVar14 + 1);
                  } while (lVar16 != 0x40);
                  input = (uchar *)*local_b30;
                  mbedtls_md_starts(&local_b20);
                  mbedtls_md_update(&local_b20,(uchar *)&local_838,8);
                  sVar9 = strlen((char *)input);
                  mbedtls_md_update(&local_b20,input,sVar9);
                  mbedtls_md_finish(&local_b20,(uchar *)&local_a78);
                  local_af8 = local_a78;
                  uStack_af0 = uStack_a70;
                  sVar15 = fwrite(&local_af8,1,0x10,__s_00);
                  sVar9 = local_ae0;
                  if (sVar15 == 0x10) {
                    local_a68 = 0;
                    uStack_a60 = 0;
                    local_a78 = local_af8;
                    uStack_a70 = uStack_af0;
                    iVar6 = 0x2000;
                    do {
                      mbedtls_md_starts(&local_b20);
                      mbedtls_md_update(&local_b20,(uchar *)&local_a78,0x20);
                      mbedtls_md_update(&local_b20,local_a38,sVar9);
                      mbedtls_md_finish(&local_b20,(uchar *)&local_a78);
                      iVar6 = iVar6 + -1;
                    } while (iVar6 != 0);
                    iVar6 = mbedtls_cipher_setkey
                                      (&local_ad8,(uchar *)&local_a78,local_b00->key_bitlen,
                                       MBEDTLS_ENCRYPT);
                    if (iVar6 != 0) {
                      main_cold_4();
                      goto LAB_00107159;
                    }
                    iVar6 = mbedtls_cipher_set_iv(&local_ad8,(uchar *)&local_af8,0x10);
                    if (iVar6 == 0) {
                      iVar6 = mbedtls_cipher_reset(&local_ad8);
                      if (iVar6 == 0) {
                        mbedtls_md_hmac_starts(&local_b20,(uchar *)&local_a78,0x20);
                        if (uVar13 != 0) {
                          local_b30 = (char **)(uVar13 & 0xffffffff);
                          lVar16 = 0;
                          do {
                            if (local_ad8.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                              sVar9 = 0;
                              if ((long)local_b30 - lVar16 < 1) goto LAB_00106ac5;
                            }
                            else {
                              sVar9 = (size_t)(local_ad8.cipher_info)->block_size;
                              if ((long)local_b30 - lVar16 <= (long)sVar9) {
LAB_00106ac5:
                                sVar9 = (size_t)(uint)((int)uVar13 - (int)lVar16);
                              }
                            }
                            sVar15 = fread(&local_838,1,sVar9,__stream);
                            if (sVar15 != sVar9) {
                              fprintf(_stderr,"fread(%ld bytes) failed\n",sVar9);
                              goto LAB_00107159;
                            }
                            iVar6 = mbedtls_cipher_update
                                              (&local_ad8,(uchar *)&local_838,sVar9,local_438,
                                               &local_b40);
                            if (iVar6 != 0) {
                              main_cold_7();
LAB_00107275:
                              local_b5c = 1;
                              goto LAB_00107286;
                            }
                            mbedtls_md_hmac_update(&local_b20,local_438,local_b40);
                            sVar9 = fwrite(local_438,1,local_b40,__s_00);
                            if (sVar9 != local_b40) {
                              fprintf(_stderr,"fwrite(%ld bytes) failed\n");
                              goto LAB_00107275;
                            }
                            if (local_ad8.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                              uVar17 = 0;
                            }
                            else {
                              uVar17 = (ulong)(local_ad8.cipher_info)->block_size;
                            }
                            lVar16 = lVar16 + uVar17;
                          } while (lVar16 < (long)uVar13);
                        }
                        iVar6 = mbedtls_cipher_finish(&local_ad8,local_438,&local_b40);
                        if (iVar6 == 0) {
                          mbedtls_md_hmac_update(&local_b20,local_438,local_b40);
                          sVar9 = fwrite(local_438,1,local_b40,__s_00);
                          if (sVar9 == local_b40) {
                            mbedtls_md_hmac_finish(&local_b20,(uchar *)&local_a78);
                            pmVar8 = local_b08;
                            bVar2 = mbedtls_md_get_size(local_b08);
                            sVar9 = fwrite(&local_a78,1,(ulong)bVar2,__s_00);
                            bVar2 = mbedtls_md_get_size(pmVar8);
                            if (sVar9 == bVar2) {
                              if (local_b28 == 1) goto LAB_00106c3d;
                              local_b5c = 0;
                              goto LAB_00107286;
                            }
                            main_cold_9();
                          }
                          else {
                            fprintf(_stderr,"fwrite(%ld bytes) failed\n");
                          }
                        }
                        else {
                          main_cold_8();
                        }
                      }
                      else {
                        main_cold_6();
                      }
                    }
                    else {
                      main_cold_5();
                    }
                    local_b5c = 1;
                  }
                  else {
                    main_cold_3();
                  }
                }
                else {
LAB_00106c3d:
                  pmVar8 = local_b08;
                  bVar2 = mbedtls_md_get_size(local_b08);
                  if ((long)uVar13 < (long)((ulong)bVar2 + 0x10)) {
                    main_cold_19();
                  }
                  else if ((local_ad8.cipher_info == (mbedtls_cipher_info_t *)0x0) ||
                          ((local_ad8.cipher_info)->block_size == 0)) {
                    main_cold_18();
                  }
                  else if (local_b00->mode == MBEDTLS_MODE_GCM) {
LAB_00106cb7:
                    bVar2 = mbedtls_md_get_size(pmVar8);
                    sVar15 = fread(&local_838,1,0x10,__stream);
                    sVar9 = local_ae0;
                    if (sVar15 == 0x10) {
                      uVar13 = (uVar13 - bVar2) - 0x10;
                      local_af8 = local_838;
                      uStack_af0 = uStack_830;
                      local_a68 = 0;
                      uStack_a60 = 0;
                      local_a78 = local_838;
                      uStack_a70 = uStack_830;
                      iVar6 = 0x2000;
                      do {
                        local_b5c = 1;
                        mbedtls_md_starts(&local_b20);
                        mbedtls_md_update(&local_b20,(uchar *)&local_a78,0x20);
                        mbedtls_md_update(&local_b20,local_a38,sVar9);
                        mbedtls_md_finish(&local_b20,(uchar *)&local_a78);
                        iVar6 = iVar6 + -1;
                      } while (iVar6 != 0);
                      iVar6 = mbedtls_cipher_setkey
                                        (&local_ad8,(uchar *)&local_a78,local_b00->key_bitlen,
                                         MBEDTLS_DECRYPT);
                      if (iVar6 == 0) {
                        iVar6 = mbedtls_cipher_set_iv(&local_ad8,(uchar *)&local_af8,0x10);
                        if (iVar6 == 0) {
                          iVar6 = mbedtls_cipher_reset(&local_ad8);
                          if (iVar6 == 0) {
                            mbedtls_md_hmac_starts(&local_b20,(uchar *)&local_a78,0x20);
                            if (0 < (long)uVar13) {
                              local_b30 = (char **)(uVar13 & 0xffffffff);
                              lVar16 = 0;
                              do {
                                if (local_ad8.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                                  sVar9 = 0;
                                  if ((long)local_b30 - lVar16 < 1) goto LAB_00106e3e;
                                }
                                else {
                                  sVar9 = (size_t)(local_ad8.cipher_info)->block_size;
                                  if ((long)local_b30 - lVar16 <= (long)sVar9) {
LAB_00106e3e:
                                    sVar9 = (size_t)(uint)((int)uVar13 - (int)lVar16);
                                  }
                                }
                                sVar15 = fread(&local_838,1,sVar9,__stream);
                                if (sVar15 != sVar9) {
                                  main_cold_14();
                                  goto LAB_00107159;
                                }
                                mbedtls_md_hmac_update(&local_b20,(uchar *)&local_838,sVar9);
                                iVar6 = mbedtls_cipher_update
                                                  (&local_ad8,(uchar *)&local_838,sVar9,local_438,
                                                   &local_b40);
                                if (iVar6 != 0) {
                                  main_cold_15();
                                  goto LAB_00107159;
                                }
                                sVar9 = fwrite(local_438,1,local_b40,__s_00);
                                if (sVar9 != local_b40) {
                                  fprintf(_stderr,"fwrite(%ld bytes) failed\n");
                                  goto LAB_00107159;
                                }
                                if (local_ad8.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                                  uVar17 = 0;
                                }
                                else {
                                  uVar17 = (ulong)(local_ad8.cipher_info)->block_size;
                                }
                                lVar16 = lVar16 + uVar17;
                              } while (lVar16 < (long)uVar13);
                            }
                            mbedtls_md_hmac_finish(&local_b20,(uchar *)&local_a78);
                            pmVar8 = local_b08;
                            bVar2 = mbedtls_md_get_size(local_b08);
                            sVar9 = fread(&local_838,1,(ulong)bVar2,__stream);
                            bVar2 = mbedtls_md_get_size(pmVar8);
                            if (sVar9 != bVar2) {
                              main_cold_16();
                              goto LAB_00107159;
                            }
                            uVar3 = mbedtls_md_get_size(pmVar8);
                            if (uVar3 != '\0') {
                              uVar13 = 0;
                              bVar2 = 0;
                              do {
                                bVar2 = bVar2 | *(byte *)((long)&local_838 + uVar13) ^
                                                *(byte *)((long)&local_a78 + uVar13);
                                uVar13 = uVar13 + 1;
                                bVar4 = mbedtls_md_get_size(pmVar8);
                              } while (uVar13 < bVar4);
                              if (bVar2 != 0) {
                                main_cold_17();
                                goto LAB_00107286;
                              }
                            }
                            mbedtls_cipher_finish(&local_ad8,local_438,&local_b40);
                            sVar9 = fwrite(local_438,1,local_b40,__s_00);
                            if (sVar9 == local_b40) {
                              local_b5c = 0;
                            }
                            else {
                              fprintf(_stderr,"fwrite(%ld bytes) failed\n");
                            }
                          }
                          else {
                            main_cold_13();
                          }
                        }
                        else {
                          main_cold_12();
                        }
                      }
                      else {
                        main_cold_11();
LAB_00107159:
                        local_b5c = 1;
                      }
                    }
                    else {
                      main_cold_10();
                    }
                  }
                  else {
                    bVar2 = mbedtls_md_get_size(pmVar8);
                    if (local_ad8.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                      uVar17 = 0;
                    }
                    else {
                      uVar17 = (ulong)(local_ad8.cipher_info)->block_size;
                      if ((long)(uVar13 - bVar2) % (long)uVar17 == 0) goto LAB_00106cb7;
                    }
                    fprintf(_stderr,"File content not a multiple of the block size (%d).\n",uVar17);
                  }
                }
              }
              else {
                main_cold_2();
              }
            }
            else {
              main_cold_1();
LAB_001070b1:
              local_b5c = 1;
            }
LAB_00107286:
            fclose(__stream);
            fclose(__s_00);
            argv = local_b38;
            goto LAB_0010729b;
          }
          main_cold_23();
        }
      }
    }
    else {
      main_cold_26();
    }
    local_b5c = 1;
  }
  else {
    puts(
        "\n  crypt_and_hash <mode> <input filename> <output filename> <cipher> <mbedtls_md> <key>\n\n   <mode>: 0 = encrypt, 1 = decrypt\n\n  example: crypt_and_hash 0 file file.aes AES-128-CBC SHA1 hex:E76B2413958B00E193\n"
        );
    puts("Available ciphers:");
    pmVar10 = (mbedtls_cipher_type_t *)mbedtls_cipher_list();
    cipher_type = *pmVar10;
    while (cipher_type != MBEDTLS_CIPHER_NONE) {
      pmVar10 = pmVar10 + 1;
      pmVar7 = mbedtls_cipher_info_from_type(cipher_type);
      printf("  %s\n",pmVar7->name);
      cipher_type = *pmVar10;
    }
    puts("\nAvailable message digests:");
    pmVar11 = (mbedtls_md_type_t *)mbedtls_md_list();
    md_type = *pmVar11;
    local_b5c = 1;
    while (md_type != MBEDTLS_MD_NONE) {
      pmVar11 = pmVar11 + 1;
      pmVar8 = mbedtls_md_info_from_type(md_type);
      pcVar12 = mbedtls_md_get_name(pmVar8);
      printf("  %s\n",pcVar12);
      md_type = *pmVar11;
    }
LAB_0010729b:
    if (argc < 1) goto LAB_001072c4;
  }
  uVar13 = 0;
  do {
    pcVar12 = argv[uVar13];
    sVar9 = strlen(pcVar12);
    mbedtls_platform_zeroize(pcVar12,sVar9);
    uVar13 = uVar13 + 1;
  } while ((uint)argc != uVar13);
LAB_001072c4:
  mbedtls_platform_zeroize(&local_af8,0x10);
  mbedtls_platform_zeroize(local_a38,0x200);
  mbedtls_platform_zeroize(&local_838,0x400);
  mbedtls_platform_zeroize(local_438,0x400);
  mbedtls_platform_zeroize(&local_a78,0x40);
  mbedtls_cipher_free(&local_ad8);
  mbedtls_md_free(&local_b20);
  return local_b5c;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1, i, n;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    int mode;
    size_t keylen, ilen, olen;
    FILE *fkey, *fin = NULL, *fout = NULL;

    char *p;
    unsigned char IV[16];
    unsigned char key[512];
    unsigned char digest[MBEDTLS_MD_MAX_SIZE];
    unsigned char buffer[1024];
    unsigned char output[1024];
    unsigned char diff;

    const mbedtls_cipher_info_t *cipher_info;
    const mbedtls_md_info_t *md_info;
    mbedtls_cipher_context_t cipher_ctx;
    mbedtls_md_context_t md_ctx;
#if defined(_WIN32_WCE)
    long filesize, offset;
#elif defined(_WIN32)
       LARGE_INTEGER li_size;
    __int64 filesize, offset;
#else
      off_t filesize, offset;
#endif

    mbedtls_cipher_init( &cipher_ctx );
    mbedtls_md_init( &md_ctx );

    /*
     * Parse the command-line arguments.
     */
    if( argc != 7 )
    {
        const int *list;

        mbedtls_printf( USAGE );

        mbedtls_printf( "Available ciphers:\n" );
        list = mbedtls_cipher_list();
        while( *list )
        {
            cipher_info = mbedtls_cipher_info_from_type( *list );
            mbedtls_printf( "  %s\n", cipher_info->name );
            list++;
        }

        mbedtls_printf( "\nAvailable message digests:\n" );
        list = mbedtls_md_list();
        while( *list )
        {
            md_info = mbedtls_md_info_from_type( *list );
            mbedtls_printf( "  %s\n", mbedtls_md_get_name( md_info ) );
            list++;
        }

#if defined(_WIN32)
        mbedtls_printf( "\n  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif

        goto exit;
    }

    mode = atoi( argv[1] );

    if( mode != MODE_ENCRYPT && mode != MODE_DECRYPT )
    {
        mbedtls_fprintf( stderr, "invalid operation mode\n" );
        goto exit;
    }

    if( strcmp( argv[2], argv[3] ) == 0 )
    {
        mbedtls_fprintf( stderr, "input and output filenames must differ\n" );
        goto exit;
    }

    if( ( fin = fopen( argv[2], "rb" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,rb) failed\n", argv[2] );
        goto exit;
    }

    if( ( fout = fopen( argv[3], "wb+" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,wb+) failed\n", argv[3] );
        goto exit;
    }

    /*
     * Read the Cipher and MD from the command line
     */
    cipher_info = mbedtls_cipher_info_from_string( argv[4] );
    if( cipher_info == NULL )
    {
        mbedtls_fprintf( stderr, "Cipher '%s' not found\n", argv[4] );
        goto exit;
    }
    if( ( ret = mbedtls_cipher_setup( &cipher_ctx, cipher_info) ) != 0 )
    {
        mbedtls_fprintf( stderr, "mbedtls_cipher_setup failed\n" );
        goto exit;
    }

    md_info = mbedtls_md_info_from_string( argv[5] );
    if( md_info == NULL )
    {
        mbedtls_fprintf( stderr, "Message Digest '%s' not found\n", argv[5] );
        goto exit;
    }

    if( mbedtls_md_setup( &md_ctx, md_info, 1 ) != 0 )
    {
        mbedtls_fprintf( stderr, "mbedtls_md_setup failed\n" );
        goto exit;
    }

    /*
     * Read the secret key from file or command line
     */
    if( ( fkey = fopen( argv[6], "rb" ) ) != NULL )
    {
        keylen = fread( key, 1, sizeof( key ), fkey );
        fclose( fkey );
    }
    else
    {
        if( memcmp( argv[6], "hex:", 4 ) == 0 )
        {
            p = &argv[6][4];
            keylen = 0;

            while( sscanf( p, "%02X", &n ) > 0 &&
                   keylen < (int) sizeof( key ) )
            {
                key[keylen++] = (unsigned char) n;
                p += 2;
            }
        }
        else
        {
            keylen = strlen( argv[6] );

            if( keylen > (int) sizeof( key ) )
                keylen = (int) sizeof( key );

            memcpy( key, argv[6], keylen );
        }
    }

#if defined(_WIN32_WCE)
    filesize = fseek( fin, 0L, SEEK_END );
#else
#if defined(_WIN32)
    /*
     * Support large files (> 2Gb) on Win32
     */
    li_size.QuadPart = 0;
    li_size.LowPart  =
        SetFilePointer( (HANDLE) _get_osfhandle( _fileno( fin ) ),
                        li_size.LowPart, &li_size.HighPart, FILE_END );

    if( li_size.LowPart == 0xFFFFFFFF && GetLastError() != NO_ERROR )
    {
        mbedtls_fprintf( stderr, "SetFilePointer(0,FILE_END) failed\n" );
        goto exit;
    }

    filesize = li_size.QuadPart;
#else
    if( ( filesize = lseek( fileno( fin ), 0, SEEK_END ) ) < 0 )
    {
        perror( "lseek" );
        goto exit;
    }
#endif
#endif

    if( fseek( fin, 0, SEEK_SET ) < 0 )
    {
        mbedtls_fprintf( stderr, "fseek(0,SEEK_SET) failed\n" );
        goto exit;
    }

    if( mode == MODE_ENCRYPT )
    {
        /*
         * Generate the initialization vector as:
         * IV = MD( filesize || filename )[0..15]
         */
        for( i = 0; i < 8; i++ )
            buffer[i] = (unsigned char)( filesize >> ( i << 3 ) );

        p = argv[2];

        mbedtls_md_starts( &md_ctx );
        mbedtls_md_update( &md_ctx, buffer, 8 );
        mbedtls_md_update( &md_ctx, (unsigned char *) p, strlen( p ) );
        mbedtls_md_finish( &md_ctx, digest );

        memcpy( IV, digest, 16 );

        /*
         * Append the IV at the beginning of the output.
         */
        if( fwrite( IV, 1, 16, fout ) != 16 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &md_ctx );
            mbedtls_md_update( &md_ctx, digest, 32 );
            mbedtls_md_update( &md_ctx, key, keylen );
            mbedtls_md_finish( &md_ctx, digest );

        }

        if( mbedtls_cipher_setkey( &cipher_ctx, digest, cipher_info->key_bitlen,
                           MBEDTLS_ENCRYPT ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_setkey() returned error\n");
            goto exit;
        }
        if( mbedtls_cipher_set_iv( &cipher_ctx, IV, 16 ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_set_iv() returned error\n");
            goto exit;
        }
        if( mbedtls_cipher_reset( &cipher_ctx ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_reset() returned error\n");
            goto exit;
        }

        mbedtls_md_hmac_starts( &md_ctx, digest, 32 );

        /*
         * Encrypt and write the ciphertext.
         */
        for( offset = 0; offset < filesize; offset += mbedtls_cipher_get_block_size( &cipher_ctx ) )
        {
            ilen = ( (unsigned int) filesize - offset > mbedtls_cipher_get_block_size( &cipher_ctx ) ) ?
                mbedtls_cipher_get_block_size( &cipher_ctx ) : (unsigned int) ( filesize - offset );

            if( fread( buffer, 1, ilen, fin ) != ilen )
            {
                mbedtls_fprintf( stderr, "fread(%ld bytes) failed\n", (long) ilen );
                goto exit;
            }

            if( mbedtls_cipher_update( &cipher_ctx, buffer, ilen, output, &olen ) != 0 )
            {
                mbedtls_fprintf( stderr, "mbedtls_cipher_update() returned error\n");
                goto exit;
            }

            mbedtls_md_hmac_update( &md_ctx, output, olen );

            if( fwrite( output, 1, olen, fout ) != olen )
            {
                mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
                goto exit;
            }
        }

        if( mbedtls_cipher_finish( &cipher_ctx, output, &olen ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_finish() returned error\n" );
            goto exit;
        }
        mbedtls_md_hmac_update( &md_ctx, output, olen );

        if( fwrite( output, 1, olen, fout ) != olen )
        {
            mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
            goto exit;
        }

        /*
         * Finally write the HMAC.
         */
        mbedtls_md_hmac_finish( &md_ctx, digest );

        if( fwrite( digest, 1, mbedtls_md_get_size( md_info ), fout ) != mbedtls_md_get_size( md_info ) )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", mbedtls_md_get_size( md_info ) );
            goto exit;
        }
    }

    if( mode == MODE_DECRYPT )
    {
        /*
         *  The encrypted file must be structured as follows:
         *
         *        00 .. 15              Initialization Vector
         *        16 .. 31              Encrypted Block #1
         *           ..
         *      N*16 .. (N+1)*16 - 1    Encrypted Block #N
         *  (N+1)*16 .. (N+1)*16 + n    Hash(ciphertext)
         */
        if( filesize < 16 + mbedtls_md_get_size( md_info ) )
        {
            mbedtls_fprintf( stderr, "File too short to be encrypted.\n" );
            goto exit;
        }

        if( mbedtls_cipher_get_block_size( &cipher_ctx ) == 0 )
        {
            mbedtls_fprintf( stderr, "Invalid cipher block size: 0. \n" );
            goto exit;
        }

        /*
         * Check the file size.
         */
        if( cipher_info->mode != MBEDTLS_MODE_GCM &&
            ( ( filesize - mbedtls_md_get_size( md_info ) ) %
                mbedtls_cipher_get_block_size( &cipher_ctx ) ) != 0 )
        {
            mbedtls_fprintf( stderr, "File content not a multiple of the block size (%d).\n",
                     mbedtls_cipher_get_block_size( &cipher_ctx ));
            goto exit;
        }

        /*
         * Subtract the IV + HMAC length.
         */
        filesize -= ( 16 + mbedtls_md_get_size( md_info ) );

        /*
         * Read the IV and original filesize modulo 16.
         */
        if( fread( buffer, 1, 16, fin ) != 16 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
            goto exit;
        }

        memcpy( IV, buffer, 16 );

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &md_ctx );
            mbedtls_md_update( &md_ctx, digest, 32 );
            mbedtls_md_update( &md_ctx, key, keylen );
            mbedtls_md_finish( &md_ctx, digest );
        }

        if( mbedtls_cipher_setkey( &cipher_ctx, digest, cipher_info->key_bitlen,
                           MBEDTLS_DECRYPT ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_setkey() returned error\n" );
            goto exit;
        }

        if( mbedtls_cipher_set_iv( &cipher_ctx, IV, 16 ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_set_iv() returned error\n" );
            goto exit;
        }

        if( mbedtls_cipher_reset( &cipher_ctx ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_reset() returned error\n" );
            goto exit;
        }

        mbedtls_md_hmac_starts( &md_ctx, digest, 32 );

        /*
         * Decrypt and write the plaintext.
         */
        for( offset = 0; offset < filesize; offset += mbedtls_cipher_get_block_size( &cipher_ctx ) )
        {
            ilen = ( (unsigned int) filesize - offset > mbedtls_cipher_get_block_size( &cipher_ctx ) ) ?
                mbedtls_cipher_get_block_size( &cipher_ctx ) : (unsigned int) ( filesize - offset );

            if( fread( buffer, 1, ilen, fin ) != ilen )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n",
                    mbedtls_cipher_get_block_size( &cipher_ctx ) );
                goto exit;
            }

            mbedtls_md_hmac_update( &md_ctx, buffer, ilen );
            if( mbedtls_cipher_update( &cipher_ctx, buffer, ilen, output,
                                       &olen ) != 0 )
            {
                mbedtls_fprintf( stderr, "mbedtls_cipher_update() returned error\n" );
                goto exit;
            }

            if( fwrite( output, 1, olen, fout ) != olen )
            {
                mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
                goto exit;
            }
        }

        /*
         * Verify the message authentication code.
         */
        mbedtls_md_hmac_finish( &md_ctx, digest );

        if( fread( buffer, 1, mbedtls_md_get_size( md_info ), fin ) != mbedtls_md_get_size( md_info ) )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", mbedtls_md_get_size( md_info ) );
            goto exit;
        }

        /* Use constant-time buffer comparison */
        diff = 0;
        for( i = 0; i < mbedtls_md_get_size( md_info ); i++ )
            diff |= digest[i] ^ buffer[i];

        if( diff != 0 )
        {
            mbedtls_fprintf( stderr, "HMAC check failed: wrong key, "
                             "or file corrupted.\n" );
            goto exit;
        }

        /*
         * Write the final block of data
         */
        mbedtls_cipher_finish( &cipher_ctx, output, &olen );

        if( fwrite( output, 1, olen, fout ) != olen )
        {
            mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
            goto exit;
        }
    }

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:
    if( fin )
        fclose( fin );
    if( fout )
        fclose( fout );

    /* Zeroize all command line arguments to also cover
       the case when the user has missed or reordered some,
       in which case the key might not be in argv[6]. */
    for( i = 0; i < argc; i++ )
        mbedtls_platform_zeroize( argv[i], strlen( argv[i] ) );

    mbedtls_platform_zeroize( IV,     sizeof( IV ) );
    mbedtls_platform_zeroize( key,    sizeof( key ) );
    mbedtls_platform_zeroize( buffer, sizeof( buffer ) );
    mbedtls_platform_zeroize( output, sizeof( output ) );
    mbedtls_platform_zeroize( digest, sizeof( digest ) );

    mbedtls_cipher_free( &cipher_ctx );
    mbedtls_md_free( &md_ctx );

    return( exit_code );
}